

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void irem_ga20_w(void *info,UINT8 offset,UINT8 data)

{
  IremGA20_channel_def *ch_00;
  int channel;
  IremGA20_channel_def *ch;
  ga20_state *chip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  *(UINT8 *)((long)info + (ulong)(offset & 0x1f) + 0x14) = data;
  ch_00 = (IremGA20_channel_def *)
          ((long)info + (long)(int)(uint)((offset & 0x1f) >> 3) * 0x1c + 0x34);
  switch(offset & 7) {
  case 0:
    ch_00->start = ch_00->start & 0xff000 | (uint)data << 4;
    break;
  case 1:
    ch_00->start = ch_00->start & 0xff0 | (uint)data << 0xc;
    break;
  case 2:
    ch_00->end = ch_00->end & 0xff000 | (uint)data << 4;
    break;
  case 3:
    ch_00->end = ch_00->end & 0xff0 | (uint)data << 0xc;
    break;
  case 4:
    ch_00->rate = data;
    ch_00->fracrate = (UINT32)(0x10000 / (long)(int)(0x100 - (uint)ch_00->rate));
    break;
  case 5:
    ch_00->volume = (UINT16)(((uint)data << 8) / (data + 10));
    break;
  case 6:
    if ((data & 2) == 0) {
      ch_00->play = '\0';
    }
    else {
      ch_00->play = '\x01';
      ch_00->pos = ch_00->start;
      ch_00->counter = ch_00->rate;
      ch_00->frac = 0;
      irem_ga20_cache_samples((ga20_state *)info,ch_00);
    }
  }
  return;
}

Assistant:

static void irem_ga20_w(void *info, UINT8 offset, UINT8 data)
{
	ga20_state *chip = (ga20_state *)info;
	struct IremGA20_channel_def* ch;
	int channel;

	//logerror("GA20:  Offset %02x, data %04x\n",offset,data);

	offset &= 0x1F;
	channel = offset >> 3;

	chip->regs[offset] = data;

	// channel regs:
	// 0,1: start address
	// 2,3: end? address
	// 4: rate
	// 5: volume
	// 6: control
	// 7: voice status (read-only)

	ch = &chip->channel[channel];
	switch (offset & 0x7)
	{
		case 0: /* start address low */
			ch->start = (ch->start&0xff000) | (data<<4);
			break;

		case 1: /* start address high */
			ch->start = (ch->start&0x00ff0) | (data<<12);
			break;

		case 2: /* end? address low */
			ch->end = (ch->end&0xff000) | (data<<4);
			break;

		case 3: /* end? address high */
			ch->end = (ch->end&0x00ff0) | (data<<12);
			break;

		case 4:
			ch->rate = data;
			ch->fracrate = (1 << RATE_SHIFT) / (0x100 - ch->rate);
			break;

		case 5: //AT: gain control
			ch->volume = (data * MAX_VOL) / (data + 10);
			break;

		case 6: //AT: this is always written 2(enabling both channels?)
			// d1: key on/off
			if (data & 2)
			{
				ch->play = 1;
				ch->pos = ch->start;
				ch->counter = ch->rate;
				ch->frac = 0;
				irem_ga20_cache_samples(chip, ch);
			}
			else
			{
				ch->play = 0;
			}

			// other: unknown/unused
			// possibilities are: loop flag, left/right speaker(stereo)
			break;
	}
}